

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyRecordUsageCache.cpp
# Opt level: O0

void __thiscall
Js::PropertyRecordUsageCache::PropertyRecordUsageCache
          (PropertyRecordUsageCache *this,StaticType *type,PropertyRecord *propertyRecord)

{
  JavascriptLibrary *pJVar1;
  ScriptContextPolymorphicInlineCache *pSVar2;
  nullptr_t local_30;
  nullptr_t local_28;
  PropertyRecord *local_20;
  PropertyRecord *propertyRecord_local;
  StaticType *type_local;
  PropertyRecordUsageCache *this_local;
  
  local_20 = propertyRecord;
  propertyRecord_local = (PropertyRecord *)type;
  type_local = (StaticType *)this;
  Memory::WriteBarrierPtr<const_Js::PropertyRecord>::WriteBarrierPtr
            (&this->propertyRecord,propertyRecord);
  local_28 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::PolymorphicInlineCache>::WriteBarrierPtr
            (&this->ldElemInlineCache,&local_28);
  local_30 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::PolymorphicInlineCache>::WriteBarrierPtr
            (&this->stElemInlineCache,&local_30);
  this->hitRate = 0;
  pJVar1 = Js::Type::GetLibrary((Type *)propertyRecord_local);
  pSVar2 = ScriptContextPolymorphicInlineCache::New(1,pJVar1);
  Memory::WriteBarrierPtr<Js::PolymorphicInlineCache>::operator=
            (&this->ldElemInlineCache,&pSVar2->super_PolymorphicInlineCache);
  pJVar1 = Js::Type::GetLibrary((Type *)propertyRecord_local);
  pSVar2 = ScriptContextPolymorphicInlineCache::New(1,pJVar1);
  Memory::WriteBarrierPtr<Js::PolymorphicInlineCache>::operator=
            (&this->stElemInlineCache,&pSVar2->super_PolymorphicInlineCache);
  return;
}

Assistant:

PropertyRecordUsageCache::PropertyRecordUsageCache(StaticType* type, const PropertyRecord* propertyRecord) :
        propertyRecord(propertyRecord),
        ldElemInlineCache(nullptr),
        stElemInlineCache(nullptr),
        hitRate(0)
    {
        // TODO: in future, might be worth putting these inline to avoid extra allocations. PIC copy API needs to be updated to support this though
        this->ldElemInlineCache = ScriptContextPolymorphicInlineCache::New(MinPropertyStringInlineCacheSize, type->GetLibrary());
        this->stElemInlineCache = ScriptContextPolymorphicInlineCache::New(MinPropertyStringInlineCacheSize, type->GetLibrary());
    }